

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O2

type __thiscall
dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::
set<dlib::image_window>
          (member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void> *this,
          image_window *object,mfp_pointer_type cb)

{
  undefined8 *puVar1;
  undefined8 in_RCX;
  
  (*(code *)**(this->super_mfp_kernel_1_base_class<3UL>).mp_memory.data)();
  puVar1 = (undefined8 *)(this->super_mfp_kernel_1_base_class<3UL>).mp_memory.data;
  puVar1[1] = object;
  *(undefined4 *)(puVar1 + 2) = 0;
  puVar1[3] = cb;
  puVar1[4] = in_RCX;
  *puVar1 = &PTR__mp_base_base_00339060;
  return;
}

Assistant:

typename disable_if<is_const_type<T>,void>::type 
        set(T& object, typename mp_impl<T>::mfp_pointer_type cb) 
        { DLIB_MFP_SC;  destroy_mp_memory(); mp_impl_T<mp_impl<T> >(&object,cb).safe_clone(mp_memory); }